

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uni_event_list.c
# Opt level: O3

int EventListClear(EventListHandle handle)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  
  lVar1 = (long)handle + 0x60;
  uni_mutex_lock(lVar1);
  plVar4 = *handle;
  if (plVar4 != (long *)0x0 && plVar4 != (long *)handle) {
    do {
      lVar2 = *plVar4;
      plVar3 = (long *)plVar4[1];
      *plVar3 = lVar2;
      *(long **)(lVar2 + 8) = plVar3;
      plVar4[1] = (long)plVar4;
      *plVar4 = (long)plVar4;
      *(int *)((long)handle + 0x30) = *(int *)((long)handle + 0x30) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar4);
      uni_mutex_lock(lVar1);
      plVar4 = *handle;
      if (plVar4 == (long *)handle) break;
    } while (plVar4 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  uni_mutex_lock(lVar1);
  plVar4 = *(long **)((long)handle + 0x10);
  if (plVar4 != (long *)0x0 && plVar4 != (long *)((long)handle + 0x10)) {
    do {
      lVar2 = *plVar4;
      plVar3 = (long *)plVar4[1];
      *plVar3 = lVar2;
      *(long **)(lVar2 + 8) = plVar3;
      plVar4[1] = (long)plVar4;
      *plVar4 = (long)plVar4;
      *(int *)((long)handle + 0x34) = *(int *)((long)handle + 0x34) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar4);
      uni_mutex_lock(lVar1);
      plVar4 = *(long **)((long)handle + 0x10);
      if (plVar4 == (long *)((long)handle + 0x10)) break;
    } while (plVar4 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  uni_mutex_lock(lVar1);
  plVar4 = *(long **)((long)handle + 0x20);
  if (plVar4 != (long *)0x0 && plVar4 != (long *)((long)handle + 0x20)) {
    do {
      lVar2 = *plVar4;
      plVar3 = (long *)plVar4[1];
      *plVar3 = lVar2;
      *(long **)(lVar2 + 8) = plVar3;
      plVar4[1] = (long)plVar4;
      *plVar4 = (long)plVar4;
      *(int *)((long)handle + 0x38) = *(int *)((long)handle + 0x38) + -1;
      uni_mutex_unlock(lVar1);
      free(plVar4);
      uni_mutex_lock(lVar1);
      plVar4 = *(long **)((long)handle + 0x20);
      if (plVar4 == (long *)((long)handle + 0x20)) break;
    } while (plVar4 != (long *)0x0);
  }
  uni_mutex_unlock(lVar1);
  return 0;
}

Assistant:

int EventListClear(EventListHandle handle) {
  EventList *event_list = (EventList *)handle;
  _consume_highest_list(&event_list->highest_list, NULL, NULL, NULL,
                        &event_list->mutex, &event_list->highest_cnt,
                        &event_list->is_running);
  _consume_medium_list(&event_list->medium_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->medium_cnt,
                       &event_list->is_running);
  _consume_lowest_list(&event_list->lowest_list, NULL, NULL, NULL,
                       &event_list->mutex, &event_list->lowest_cnt,
                       &event_list->is_running);
  return 0;
}